

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChVector<double>_>::CallArchiveInConstructor
          (ChFunctorArchiveInSpecific<chrono::ChVector<double>_> *this,ChArchiveIn *marchive,
          char *classname)

{
  ChExceptionArchive *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Cannot call CallArchiveInConstructor() for a constructed object.",
             &local_39);
  ChExceptionArchive::ChExceptionArchive(this_00,&local_38);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChException::~ChException);
}

Assistant:

virtual void CallConstructor(ChArchiveIn& marchive, const char* classname) 
        { throw (ChExceptionArchive( "Cannot call CallConstructor() for a constructed object.")); }